

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathFreeCompExpr(xmlXPathCompExprPtr comp)

{
  xmlXPathStepOp *pxVar1;
  int local_1c;
  int i;
  xmlXPathStepOpPtr op;
  xmlXPathCompExprPtr comp_local;
  
  if (comp != (xmlXPathCompExprPtr)0x0) {
    if (comp->dict == (xmlDictPtr)0x0) {
      for (local_1c = 0; local_1c < comp->nbStep; local_1c = local_1c + 1) {
        pxVar1 = comp->steps + local_1c;
        if (pxVar1->value4 != (void *)0x0) {
          if (pxVar1->op == XPATH_OP_VALUE) {
            xmlXPathFreeObject((xmlXPathObjectPtr)pxVar1->value4);
          }
          else {
            (*xmlFree)(pxVar1->value4);
          }
        }
        if (pxVar1->value5 != (void *)0x0) {
          (*xmlFree)(pxVar1->value5);
        }
      }
    }
    else {
      for (local_1c = 0; local_1c < comp->nbStep; local_1c = local_1c + 1) {
        pxVar1 = comp->steps + local_1c;
        if ((pxVar1->value4 != (void *)0x0) && (pxVar1->op == XPATH_OP_VALUE)) {
          xmlXPathFreeObject((xmlXPathObjectPtr)pxVar1->value4);
        }
      }
      xmlDictFree(comp->dict);
    }
    if (comp->steps != (xmlXPathStepOp *)0x0) {
      (*xmlFree)(comp->steps);
    }
    if (comp->expr != (xmlChar *)0x0) {
      (*xmlFree)(comp->expr);
    }
    (*xmlFree)(comp);
  }
  return;
}

Assistant:

void
xmlXPathFreeCompExpr(xmlXPathCompExprPtr comp)
{
    xmlXPathStepOpPtr op;
    int i;

    if (comp == NULL)
        return;
    if (comp->dict == NULL) {
	for (i = 0; i < comp->nbStep; i++) {
	    op = &comp->steps[i];
	    if (op->value4 != NULL) {
		if (op->op == XPATH_OP_VALUE)
		    xmlXPathFreeObject(op->value4);
		else
		    xmlFree(op->value4);
	    }
	    if (op->value5 != NULL)
		xmlFree(op->value5);
	}
    } else {
	for (i = 0; i < comp->nbStep; i++) {
	    op = &comp->steps[i];
	    if (op->value4 != NULL) {
		if (op->op == XPATH_OP_VALUE)
		    xmlXPathFreeObject(op->value4);
	    }
	}
        xmlDictFree(comp->dict);
    }
    if (comp->steps != NULL) {
        xmlFree(comp->steps);
    }
#ifdef XPATH_STREAMING
    if (comp->stream != NULL) {
        xmlFreePatternList(comp->stream);
    }
#endif
    if (comp->expr != NULL) {
        xmlFree(comp->expr);
    }

    xmlFree(comp);
}